

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdtls.cpp
# Opt level: O0

void QDtls::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QDtls *_t;
  uint in_stack_ffffffffffffffb8;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      pskRequired((QDtls *)0x3bb88a,
                  (QSslPreSharedKeyAuthenticator *)(ulong)in_stack_ffffffffffffffb8);
    }
    else if (in_EDX == 1) {
      handshakeTimeout((QDtls *)0x3bb896);
    }
  }
  if ((in_ESI == 5) &&
     (bVar1 = QtMocHelpers::indexOfMethod<void(QDtls::*)(QSslPreSharedKeyAuthenticator*)>
                        (in_RCX,(void **)pskRequired,0,0), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QDtls::*)()>(in_RCX,(void **)handshakeTimeout,0,1);
  }
  return;
}

Assistant:

void QDtls::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDtls *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pskRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 1: _t->handshakeTimeout(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDtls::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QDtls::pskRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDtls::*)()>(_a, &QDtls::handshakeTimeout, 1))
            return;
    }
}